

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O1

size_t check_file(FILE *fh,size_t buffer_size,char delim,size_t fields,int *widths)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  
  __s = (char *)malloc(buffer_size);
  rewind((FILE *)fh);
  pcVar2 = fgets(__s,(int)buffer_size,(FILE *)fh);
  if (pcVar2 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      sVar4 = sVar4 + 1;
      sVar3 = strlen(__s);
      if (__s[sVar3 - 1] != '\n') {
        pcVar2 = "Line %zu will not fit into a %zu-character buffer.\n";
        fields = buffer_size;
LAB_00102015:
        fprintf(_stderr,pcVar2,sVar4,fields);
        sVar4 = 0xffffffffffffffff;
        break;
      }
      pcVar2 = strchr(__s,0x23);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(__s);
      if (1 < sVar3) {
        pcVar2 = next_token(__s,delim);
        if (fields != 0) {
          sVar5 = 1;
          do {
            if (pcVar2 == (char *)0x0) {
              fprintf(_stderr,"Line %zu contains less than %zu fields.\n",sVar4,fields);
LAB_00101faf:
              sVar4 = 0xffffffffffffffff;
              goto LAB_00101fbf;
            }
            uVar1 = widths[sVar5 - 1];
            if ((-1 < (long)(int)uVar1) &&
               (sVar3 = strlen(pcVar2), (ulong)(long)(int)uVar1 <= sVar3)) {
              fprintf(_stderr,"Line %zu: Field %zu \'%s\' will not fit in a %d character string.\n",
                      sVar4,sVar5,pcVar2,(ulong)uVar1);
              goto LAB_00101faf;
            }
            pcVar2 = next_token((char *)0x0,delim);
            bVar6 = sVar5 != fields;
            sVar5 = sVar5 + 1;
          } while (bVar6);
        }
        if (pcVar2 != (char *)0x0) {
          pcVar2 = "Line %zu contains more than %zu fields.\n";
          goto LAB_00102015;
        }
      }
      pcVar2 = fgets(__s,(int)buffer_size,(FILE *)fh);
    } while (pcVar2 != (char *)0x0);
  }
LAB_00101fbf:
  rewind((FILE *)fh);
  free(__s);
  return sVar4;
}

Assistant:

size_t check_file( FILE * fh, size_t buffer_size, char delim, size_t fields, int const * widths )
{
    /* Dynamically allocated buffer */
    char * buffer = malloc( buffer_size );
    size_t lines = 0;

    rewind( fh );

    while ( fgets( buffer, buffer_size, fh ) )
    {
        size_t i;
        char * p;

        ++lines;

        /* Check line for complete read */
        if ( buffer[ strlen( buffer ) - 1 ] != '\n' )
        {
            fprintf( stderr, "Line %zu will not fit into a %zu-character buffer.\n", lines, buffer_size );
            rewind( fh );
            free( buffer );
            return -1;
        }

        /* Remove comments */
        if ( ( p = strchr( buffer, '#' ) ) != NULL )
        {
            *p = '\0';
        }

        /* > 1 because of newline */
        if ( strlen( buffer ) > 1 )
        {
            /* Check field count and field widths */
            p = next_token( buffer, delim );

            for ( i = 0; i < fields; ++i )
            {
                if ( ! p )
                {
                    fprintf( stderr, "Line %zu contains less than %zu fields.\n", lines, fields );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                if ( widths[ i ] >= 0 && strlen( p ) >= ( unsigned )widths[ i ] )
                {
                    fprintf( stderr, "Line %zu: Field %zu '%s' will not fit in a %d character string.\n", lines, i + 1, p, widths[ i ] );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                p = next_token( NULL, delim );
            }

            if ( p )
            {
                fprintf( stderr, "Line %zu contains more than %zu fields.\n", lines, fields );
                rewind( fh );
                free( buffer );
                return -1;
            }
        }
    }

    /* Rewind, free the buffer, and report the number of lines */
    rewind( fh );
    free( buffer );
    return lines;
}